

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

optional<pbrt::SquareMatrix<3>_> *
pbrt::LinearLeastSquares<3>
          (optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr__,Float (*A) [3],Float (*B) [3],
          int rows)

{
  uint *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  SquareMatrix<3> *m1;
  long lVar4;
  Float *pFVar5;
  Float *pFVar6;
  Float *pFVar7;
  int j;
  long lVar8;
  long lVar9;
  optional<pbrt::SquareMatrix<3>_> AtAi;
  SquareMatrix<3> AtB;
  SquareMatrix<3> AtA;
  optional<pbrt::SquareMatrix<3>_> oStack_d8;
  SquareMatrix<3> local_b0;
  SquareMatrix<3> local_8c;
  SquareMatrix<3> local_68;
  SquareMatrix<3> local_44;
  
  SquareMatrix<3>::Zero();
  SquareMatrix<3>::Zero();
  lVar4 = 0;
  pFVar5 = *A;
  for (; lVar4 != 3; lVar4 = lVar4 + 1) {
    lVar8 = 0;
    pFVar6 = *B;
    pFVar7 = *A;
    for (; lVar8 != 3; lVar8 = lVar8 + 1) {
      lVar9 = 0;
      while ((ulong)(uint)(~(rows >> 0x1f) & rows) * 0xc - lVar9 != 0) {
        uVar2 = *(uint *)((long)pFVar5 + lVar9);
        auVar3 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pFVar7 + lVar9)),ZEXT416(uVar2),
                                 ZEXT416((uint)local_68.m[lVar4][lVar8]));
        local_68.m[lVar4][lVar8] = auVar3._0_4_;
        puVar1 = (uint *)((long)pFVar6 + lVar9);
        lVar9 = lVar9 + 0xc;
        auVar3 = vfmadd213ss_fma(ZEXT416(*puVar1),ZEXT416(uVar2),
                                 ZEXT416((uint)local_8c.m[lVar4][lVar8]));
        local_8c.m[lVar4][lVar8] = auVar3._0_4_;
      }
      pFVar7 = pFVar7 + 1;
      pFVar6 = pFVar6 + 1;
    }
    pFVar5 = pFVar5 + 1;
  }
  Inverse<3>(&oStack_d8,&local_68);
  if (oStack_d8.set == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    local_b0.m[0][0] = 0.0;
    local_b0.m[0][1] = 0.0;
    local_b0.m[0][2] = 0.0;
    local_b0.m[1][0] = 0.0;
    local_b0.m[1][1] = 0.0;
    local_b0.m[1][2] = 0.0;
    local_b0.m[2][0] = 0.0;
    local_b0.m[2][1] = 0.0;
  }
  else {
    m1 = pstd::optional<pbrt::SquareMatrix<3>_>::value(&oStack_d8);
    operator*(&local_44,m1,&local_8c);
    Transpose<3>(&local_b0,&local_44);
    __return_storage_ptr__->set = true;
    *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_b0.m[2][2];
  }
  *(undefined8 *)&__return_storage_ptr__->optionalValue = local_b0.m[0]._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_b0.m._8_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_b0.m[1]._4_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_b0.m[2]._0_8_;
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional(&oStack_d8);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<SquareMatrix<N>> LinearLeastSquares(const Float A[][N], const Float B[][N],
                                                   int rows) {
    SquareMatrix<N> AtA = SquareMatrix<N>::Zero();
    SquareMatrix<N> AtB = SquareMatrix<N>::Zero();

    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            for (int r = 0; r < rows; ++r) {
                AtA[i][j] += A[r][i] * A[r][j];
                AtB[i][j] += A[r][i] * B[r][j];
            }

    auto AtAi = Inverse(AtA);
    if (!AtAi)
        return {};
    return Transpose(*AtAi * AtB);
}